

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int tinyexr::EncodeChunk
              (EXRImage *exr_image,EXRHeader *exr_header,
              vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *channels,
              int num_blocks,tinyexr_uint64 chunk_offset,bool is_multipart,OffsetData *offset_data,
              vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *data_list,tinyexr_uint64 *total_size,string *err)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  size_t start_index;
  reference pvVar4;
  const_reference pvVar5;
  reference pvVar6;
  size_type sVar7;
  reference pvVar8;
  size_type sVar9;
  ulong uVar10;
  reference pvVar11;
  size_type sVar12;
  int *piVar13;
  int in_ECX;
  vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *in_RDX;
  long in_RSI;
  long *in_RDI;
  value_type in_R8;
  byte in_R9B;
  vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  *in_stack_00000008;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *in_stack_00000010;
  value_type *in_stack_00000018;
  string *in_stack_00000020;
  size_t i_2;
  int data_len;
  bool ret_1;
  size_t data_header_size;
  uchar **images;
  int num_lines;
  int end_Y;
  int start_y;
  int i_1;
  bool invalid_data;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *offsets;
  size_t i;
  size_t j;
  int ret;
  string e;
  int num_x_tiles;
  int num_y_tiles;
  int level_index_from_image;
  int level_index;
  int num_levels;
  size_t block_idx;
  EXRImage *level_image;
  tinyexr_uint64 doffset;
  tinyexr_uint64 offset;
  void *compression_param;
  size_t c;
  size_t channel_offset;
  int pixel_data_size;
  vector<unsigned_long,_std::allocator<unsigned_long>_> channel_offset_list;
  int num_scanlines;
  int in_stack_000001b8;
  int in_stack_000001bc;
  uchar **in_stack_000001c0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_000001c8;
  vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *in_stack_00000200;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000208;
  string *in_stack_00000210;
  void *in_stack_00000218;
  allocator_type *in_stack_fffffffffffffe40;
  vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *in_stack_fffffffffffffe48;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *in_stack_fffffffffffffe50;
  int local_164;
  value_type in_stack_fffffffffffffea0;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *data_list_00;
  vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  EXRImage *in_stack_fffffffffffffec8;
  int local_124;
  int local_120;
  int local_11c;
  int local_118;
  byte local_111;
  reference local_110;
  ulong local_108;
  ulong in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  int in_stack_ffffffffffffff10;
  void *in_stack_ffffffffffffff18;
  string *in_stack_ffffffffffffff20;
  int local_c0;
  size_type local_b8;
  long *local_b0;
  value_type local_a0;
  allocator_type *local_98;
  ulong local_90;
  value_type local_88;
  int local_80;
  undefined1 local_69 [25];
  int local_50;
  byte local_49;
  value_type local_48;
  int local_3c;
  vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *local_38;
  long local_30;
  long *local_28;
  int local_1c;
  
  local_49 = in_R9B & 1;
  local_48 = in_R8;
  local_3c = in_ECX;
  local_38 = in_RDX;
  local_30 = in_RSI;
  local_28 = in_RDI;
  local_50 = NumScanlines(*(int *)(in_RSI + 0x7c));
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::resize(in_stack_fffffffffffffe50,(size_type)in_stack_fffffffffffffe48);
  start_index = (size_t)*(int *)(local_30 + 0x78);
  data_list_00 = (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)local_69;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x46b824);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe50,
             (size_type)in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x46b850);
  local_80 = 0;
  local_88 = 0;
  for (local_90 = 0; local_90 < (ulong)(long)*(int *)(local_30 + 0x78); local_90 = local_90 + 1) {
    in_stack_fffffffffffffea0 = local_88;
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_69 + 1),
                        local_90);
    *pvVar4 = in_stack_fffffffffffffea0;
    pvVar5 = std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>::operator[]
                       (local_38,local_90);
    if (pvVar5->requested_pixel_type == 1) {
      local_80 = local_80 + 2;
      local_88 = local_88 + 2;
    }
    else {
      pvVar5 = std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>::
               operator[](local_38,local_90);
      if (pvVar5->requested_pixel_type == 2) {
        local_80 = local_80 + 4;
        local_88 = local_88 + 4;
      }
      else {
        pvVar5 = std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>::
                 operator[](local_38,local_90);
        if (pvVar5->requested_pixel_type == 0) {
          local_80 = local_80 + 4;
          local_88 = local_88 + 4;
        }
      }
    }
  }
  local_98 = (allocator_type *)0x0;
  local_a0 = local_48;
  uVar2 = 0;
  if ((local_49 & 1) != 0) {
    uVar2 = 4;
  }
  if (*local_28 == 0) {
    pvVar6 = std::
             vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
             ::operator[](in_stack_00000008,0);
    local_110 = std::
                vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ::operator[](pvVar6,0);
    local_111 = 0;
    local_118 = 0;
    while( true ) {
      if (local_3c <= local_118) break;
      local_11c = local_50 * local_118;
      local_124 = local_50 * (local_118 + 1);
      piVar13 = std::min<int>(&local_124,(int *)((long)local_28 + 0x24));
      local_120 = *piVar13;
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator[](in_stack_00000010,(long)local_118);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe50,
                 (size_type)in_stack_fffffffffffffe48);
      pvVar11 = std::
                vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator[](in_stack_00000010,(long)local_118);
      sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pvVar11);
      iVar3 = (int)sVar7;
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator[](in_stack_00000010,(long)local_118);
      in_stack_fffffffffffffe40 = (allocator_type *)(long)local_80;
      in_stack_fffffffffffffe50 =
           (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            *)(local_69 + 1);
      in_stack_fffffffffffffe48 = local_38;
      bVar1 = EncodePixelData(in_stack_000001c8,in_stack_000001c0,in_stack_000001bc,
                              in_stack_000001b8,exr_image._4_4_,(int)exr_image,(int)offset_data,
                              (int)data_list,(int)total_size,(size_t)err,in_stack_00000200,
                              in_stack_00000208,in_stack_00000210,in_stack_00000218);
      if (bVar1) {
        pvVar11 = std::
                  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::operator[](in_stack_00000010,(long)local_118);
        sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pvVar11);
        iVar3 = (int)sVar7 - iVar3;
        pvVar11 = std::
                  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::operator[](in_stack_00000010,(long)local_118);
        piVar13 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                   (pvVar11,0);
        *piVar13 = local_11c;
        pvVar11 = std::
                  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::operator[](in_stack_00000010,(long)local_118);
        piVar13 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                   (pvVar11,4);
        *piVar13 = iVar3;
        pvVar11 = std::
                  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::operator[](in_stack_00000010,(long)local_118);
        piVar13 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                   (pvVar11,0);
        swap4(piVar13);
        pvVar11 = std::
                  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::operator[](in_stack_00000010,(long)local_118);
        piVar13 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                   (pvVar11,4);
        swap4(piVar13);
      }
      else {
        local_111 = 1;
      }
      local_118 = local_118 + 1;
    }
    if ((local_111 & 1) != 0) {
      if (in_stack_00000020 != (string *)0x0) {
        std::__cxx11::string::operator+=(in_stack_00000020,"Failed to encode scanline data.\n");
      }
      local_1c = -4;
      goto LAB_0046c2b1;
    }
    for (uVar10 = 0; uVar10 < (ulong)(long)local_3c; uVar10 = uVar10 + 1) {
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (local_110,uVar10);
      *pvVar4 = local_a0;
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (local_110,uVar10);
      swap8(pvVar4);
      pvVar11 = std::
                vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator[](in_stack_00000010,uVar10);
      sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pvVar11);
      local_a0 = sVar7 + uVar2 + local_a0;
    }
    *in_stack_00000018 = local_a0;
  }
  else {
    local_b0 = local_28;
    local_b8 = 0;
    if (*(int *)(local_30 + 0x44) == 2) {
      local_164 = *(int *)&in_stack_00000008[1].
                           super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start *
                  *(int *)((long)&in_stack_00000008[1].
                                  super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 4);
    }
    else {
      local_164 = *(int *)&in_stack_00000008[1].
                           super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
    }
    for (local_c0 = 0; local_c0 < local_164; local_c0 = local_c0 + 1) {
      if (local_b0 == (long *)0x0) {
        if (in_stack_00000020 != (string *)0x0) {
          std::__cxx11::string::operator+=
                    (in_stack_00000020,"Invalid number of tiled levels for EncodeChunk\n");
        }
        local_1c = -4;
        goto LAB_0046c2b1;
      }
      iVar3 = LevelIndex((int)local_b0[2],*(int *)((long)local_b0 + 0x14),*(int *)(local_30 + 0x44),
                         *(int *)&in_stack_00000008[1].
                                  super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
      if (iVar3 != local_c0) {
        if (in_stack_00000020 != (string *)0x0) {
          std::__cxx11::string::operator+=
                    (in_stack_00000020,"Incorrect level ordering in tiled image\n");
        }
        local_1c = -4;
        goto LAB_0046c2b1;
      }
      pvVar6 = std::
               vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
               ::operator[](in_stack_00000008,(long)local_c0);
      sVar7 = std::
              vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ::size(pvVar6);
      pvVar6 = std::
               vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
               ::operator[](in_stack_00000008,(long)local_c0);
      pvVar8 = std::
               vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ::operator[](pvVar6,0);
      sVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(pvVar8);
      std::__cxx11::string::string((string *)&stack0xffffffffffffff10);
      in_stack_fffffffffffffe40 = local_98;
      in_stack_ffffffffffffff0c =
           EncodeTiledLevel(in_stack_fffffffffffffec8,
                            (EXRHeader *)
                            CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                            in_stack_fffffffffffffeb8,data_list_00,start_index,
                            (int)(in_stack_fffffffffffffea0 >> 0x20),(int)in_stack_ffffffffffffff00,
                            (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                            in_stack_ffffffffffffff10,in_stack_ffffffffffffff18,
                            in_stack_ffffffffffffff20);
      if (in_stack_ffffffffffffff0c == 0) {
        for (in_stack_ffffffffffffff00 = 0; in_stack_ffffffffffffff00 < (ulong)(long)(int)sVar7;
            in_stack_ffffffffffffff00 = in_stack_ffffffffffffff00 + 1) {
          for (local_108 = 0; local_108 < (ulong)(long)(int)sVar9; local_108 = local_108 + 1) {
            pvVar6 = std::
                     vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                     ::operator[](in_stack_00000008,(long)local_c0);
            pvVar8 = std::
                     vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     ::operator[](pvVar6,in_stack_ffffffffffffff00);
            pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (pvVar8,local_108);
            *pvVar4 = local_a0;
            pvVar6 = std::
                     vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                     ::operator[](in_stack_00000008,(long)local_c0);
            pvVar8 = std::
                     vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     ::operator[](pvVar6,in_stack_ffffffffffffff00);
            pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (pvVar8,local_108);
            swap8(pvVar4);
            pvVar11 = std::
                      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ::operator[](in_stack_00000010,local_b8);
            sVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pvVar11);
            local_a0 = sVar12 + uVar2 + local_a0;
            local_b8 = local_b8 + 1;
          }
        }
        local_b0 = (long *)local_b0[1];
        bVar1 = false;
      }
      else {
        uVar10 = std::__cxx11::string::empty();
        if (((uVar10 & 1) == 0) && (in_stack_00000020 != (string *)0x0)) {
          std::__cxx11::string::operator+=(in_stack_00000020,(string *)&stack0xffffffffffffff10);
        }
        bVar1 = true;
        local_1c = in_stack_ffffffffffffff0c;
      }
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff10);
      if (bVar1) goto LAB_0046c2b1;
    }
    *in_stack_00000018 = local_a0;
  }
  local_1c = 0;
LAB_0046c2b1:
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe40);
  return local_1c;
}

Assistant:

static int EncodeChunk(const EXRImage* exr_image, const EXRHeader* exr_header,
                       const std::vector<ChannelInfo>& channels,
                       int num_blocks,
                       tinyexr_uint64 chunk_offset, // starting offset of current chunk
                       bool is_multipart,
                       OffsetData& offset_data, // output block offsets, must be initialized
                       std::vector<std::vector<unsigned char> >& data_list, // output
                       tinyexr_uint64& total_size, // output: ending offset of current chunk
                       std::string* err) {
  int num_scanlines = NumScanlines(exr_header->compression_type);

  data_list.resize(num_blocks);

  std::vector<size_t> channel_offset_list(
    static_cast<size_t>(exr_header->num_channels));

  int pixel_data_size = 0;
  {
    size_t channel_offset = 0;
    for (size_t c = 0; c < static_cast<size_t>(exr_header->num_channels); c++) {
      channel_offset_list[c] = channel_offset;
      if (channels[c].requested_pixel_type == TINYEXR_PIXELTYPE_HALF) {
        pixel_data_size += sizeof(unsigned short);
        channel_offset += sizeof(unsigned short);
      } else if (channels[c].requested_pixel_type ==
                 TINYEXR_PIXELTYPE_FLOAT) {
        pixel_data_size += sizeof(float);
        channel_offset += sizeof(float);
      } else if (channels[c].requested_pixel_type == TINYEXR_PIXELTYPE_UINT) {
        pixel_data_size += sizeof(unsigned int);
        channel_offset += sizeof(unsigned int);
      } else {
        assert(0);
      }
    }
  }

  const void* compression_param = 0;
#if TINYEXR_USE_ZFP
  tinyexr::ZFPCompressionParam zfp_compression_param;

  // Use ZFP compression parameter from custom attributes(if such a parameter
  // exists)
  {
    std::string e;
    bool ret = tinyexr::FindZFPCompressionParam(
      &zfp_compression_param, exr_header->custom_attributes,
      exr_header->num_custom_attributes, &e);

    if (!ret) {
      // Use predefined compression parameter.
      zfp_compression_param.type = 0;
      zfp_compression_param.rate = 2;
    }
    compression_param = &zfp_compression_param;
  }
#endif

  tinyexr_uint64 offset = chunk_offset;
  tinyexr_uint64 doffset = is_multipart ? 4u : 0u;

  if (exr_image->tiles) {
    const EXRImage* level_image = exr_image;
    size_t block_idx = 0;
    //tinyexr::tinyexr_uint64 block_data_size = 0;
    int num_levels = (exr_header->tile_level_mode != TINYEXR_TILE_RIPMAP_LEVELS) ?
      offset_data.num_x_levels : (offset_data.num_x_levels * offset_data.num_y_levels);
    for (int level_index = 0; level_index < num_levels; ++level_index) {
      if (!level_image) {
        if (err) {
          (*err) += "Invalid number of tiled levels for EncodeChunk\n";
        }
        return TINYEXR_ERROR_INVALID_DATA;
      }

      int level_index_from_image = LevelIndex(level_image->level_x, level_image->level_y,
                                    exr_header->tile_level_mode, offset_data.num_x_levels);
      if (level_index_from_image != level_index) {
        if (err) {
          (*err) += "Incorrect level ordering in tiled image\n";
        }
        return TINYEXR_ERROR_INVALID_DATA;
      }
      int num_y_tiles = int(offset_data.offsets[level_index].size());
      assert(num_y_tiles);
      int num_x_tiles = int(offset_data.offsets[level_index][0].size());
      assert(num_x_tiles);

      std::string e;
      int ret = EncodeTiledLevel(level_image,
                                  exr_header,
                                  channels,
                                  data_list,
                                  block_idx,
                                  num_x_tiles,
                                  num_y_tiles,
                                  channel_offset_list,
                                  pixel_data_size,
                                  compression_param,
                                  &e);
      if (ret != TINYEXR_SUCCESS) {
        if (!e.empty() && err) {
          (*err) += e;
        }
        return ret;
      }

      for (size_t j = 0; j < static_cast<size_t>(num_y_tiles); ++j)
        for (size_t i = 0; i < static_cast<size_t>(num_x_tiles); ++i) {
          offset_data.offsets[level_index][j][i] = offset;
          swap8(reinterpret_cast<tinyexr_uint64*>(&offset_data.offsets[level_index][j][i]));
          offset += data_list[block_idx].size() + doffset;
          //block_data_size += data_list[block_idx].size();
          ++block_idx;
        }
      level_image = level_image->next_level;
    }
    assert(static_cast<int>(block_idx) == num_blocks);
    total_size = offset;
  } else { // scanlines
    std::vector<tinyexr::tinyexr_uint64>& offsets = offset_data.offsets[0][0];

#if TINYEXR_HAS_CXX11 && (TINYEXR_USE_THREAD > 0)
    std::atomic<bool> invalid_data(false);
    std::vector<std::thread> workers;
    std::atomic<int> block_count(0);

    int num_threads = std::min(std::max(1, int(std::thread::hardware_concurrency())), num_blocks);

    for (int t = 0; t < num_threads; t++) {
      workers.emplace_back(std::thread([&]() {
        int i = 0;
        while ((i = block_count++) < num_blocks) {

#else
    bool invalid_data(false);
#if TINYEXR_USE_OPENMP
#pragma omp parallel for
#endif
    for (int i = 0; i < num_blocks; i++) {

#endif
      int start_y = num_scanlines * i;
      int end_Y = (std::min)(num_scanlines * (i + 1), exr_image->height);
      int num_lines = end_Y - start_y;

      const unsigned char* const* images =
        static_cast<const unsigned char* const*>(exr_image->images);

      data_list[i].resize(2*sizeof(int));
      size_t data_header_size = data_list[i].size();

      bool ret = EncodePixelData(data_list[i],                         
                                 images,
                                 exr_header->compression_type,
                                 0, // increasing y
                                 exr_image->width,
                                 exr_image->height,
                                 exr_image->width,
                                 start_y,
                                 num_lines,
                                 pixel_data_size,
                                 channels,
                                 channel_offset_list,
                                 err,
                                 compression_param);
      if (!ret) {
        invalid_data = true;
        continue; // "break" cannot be used with OpenMP 
      }
      assert(data_list[i].size() > data_header_size);
      int data_len = static_cast<int>(data_list[i].size() - data_header_size);
      memcpy(&data_list[i][0], &start_y, sizeof(int));
      memcpy(&data_list[i][4], &data_len, sizeof(int));

      swap4(reinterpret_cast<int*>(&data_list[i][0]));
      swap4(reinterpret_cast<int*>(&data_list[i][4]));
#if TINYEXR_HAS_CXX11 && (TINYEXR_USE_THREAD > 0)
        }
                                       }));
    }

    for (auto &t : workers) {
      t.join();
    }
#else
    }  // omp parallel
#endif

    if (invalid_data) {
      if (err) {
        (*err) += "Failed to encode scanline data.\n";
      }
      return TINYEXR_ERROR_INVALID_DATA;
    }

    for (size_t i = 0; i < static_cast<size_t>(num_blocks); i++) {
      offsets[i] = offset;
      tinyexr::swap8(reinterpret_cast<tinyexr::tinyexr_uint64 *>(&offsets[i]));
      offset += data_list[i].size() + doffset;
    }

    total_size = static_cast<size_t>(offset);
  }
  return TINYEXR_SUCCESS;
}